

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3MinimumFileFormat(Parse *pParse,int iDb,int minFormat)

{
  int iReg;
  int iReg_00;
  int addr;
  Vdbe *p;
  int in_EDX;
  int in_ESI;
  Parse *in_RDI;
  int j1;
  int r2;
  int r1;
  Vdbe *v;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (p != (Vdbe *)0x0) {
    iReg = sqlite3GetTempReg(in_RDI);
    iReg_00 = sqlite3GetTempReg(in_RDI);
    sqlite3VdbeAddOp3((Vdbe *)in_RDI,in_ESI,in_EDX,(int)((ulong)p >> 0x20),(int)p);
    sqlite3VdbeUsesBtree((Vdbe *)CONCAT44(iReg,iReg_00),in_stack_ffffffffffffffdc);
    sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iReg,iReg_00),in_stack_ffffffffffffffdc,
                      in_stack_ffffffffffffffd8,0);
    addr = sqlite3VdbeAddOp3((Vdbe *)in_RDI,in_ESI,in_EDX,(int)((ulong)p >> 0x20),(int)p);
    sqlite3VdbeChangeP5(p,0x90);
    sqlite3VdbeAddOp3((Vdbe *)in_RDI,in_ESI,in_EDX,(int)((ulong)p >> 0x20),(int)p);
    sqlite3VdbeJumpHere((Vdbe *)CONCAT44(iReg,iReg_00),addr);
    sqlite3ReleaseTempReg(in_RDI,iReg);
    sqlite3ReleaseTempReg(in_RDI,iReg_00);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3MinimumFileFormat(Parse *pParse, int iDb, int minFormat){
  Vdbe *v;
  v = sqlite3GetVdbe(pParse);
  /* The VDBE should have been allocated before this routine is called.
  ** If that allocation failed, we would have quit before reaching this
  ** point */
  if( ALWAYS(v) ){
    int r1 = sqlite3GetTempReg(pParse);
    int r2 = sqlite3GetTempReg(pParse);
    int j1;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, r1, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    sqlite3VdbeAddOp2(v, OP_Integer, minFormat, r2);
    j1 = sqlite3VdbeAddOp3(v, OP_Ge, r2, 0, r1);
    sqlite3VdbeChangeP5(v, SQLITE_NOTNULL); VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, r2);
    sqlite3VdbeJumpHere(v, j1);
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
}